

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

SortNode * __thiscall GLDrawList::SortSpriteList(GLDrawList *this,SortNode *head)

{
  int iVar1;
  uint uVar2;
  SortNode **ppSVar3;
  SortNode *local_40;
  SortNode *parent;
  uint local_28;
  uint i;
  int count;
  SortNode *n;
  SortNode *head_local;
  GLDrawList *this_local;
  
  n = head;
  head_local = (SortNode *)this;
  if (SortSpriteList(SortNode*)::sortspritelist == '\0') {
    iVar1 = __cxa_guard_acquire(&SortSpriteList(SortNode*)::sortspritelist);
    if (iVar1 != 0) {
      TArray<SortNode_*,_SortNode_*>::TArray(&SortSpriteList::sortspritelist);
      __cxa_atexit(TArray<SortNode_*,_SortNode_*>::~TArray,&SortSpriteList::sortspritelist,
                   &__dso_handle);
      __cxa_guard_release(&SortSpriteList(SortNode*)::sortspritelist);
    }
  }
  local_40 = n->parent;
  TArray<SortNode_*,_SortNode_*>::Clear(&SortSpriteList::sortspritelist);
  for (_i = n; _i != (SortNode *)0x0; _i = _i->next) {
    TArray<SortNode_*,_SortNode_*>::Push(&SortSpriteList::sortspritelist,(SortNode **)&i);
  }
  gd = this;
  ppSVar3 = TArray<SortNode_*,_SortNode_*>::operator[](&SortSpriteList::sortspritelist,0);
  uVar2 = TArray<SortNode_*,_SortNode_*>::Size(&SortSpriteList::sortspritelist);
  qsort(ppSVar3,(ulong)uVar2,8,CompareSprite);
  local_28 = 0;
  while( true ) {
    uVar2 = TArray<SortNode_*,_SortNode_*>::Size(&SortSpriteList::sortspritelist);
    if (uVar2 <= local_28) break;
    ppSVar3 = TArray<SortNode_*,_SortNode_*>::operator[]
                        (&SortSpriteList::sortspritelist,(ulong)local_28);
    (*ppSVar3)->next = (SortNode *)0x0;
    if (local_40 != (SortNode *)0x0) {
      ppSVar3 = TArray<SortNode_*,_SortNode_*>::operator[]
                          (&SortSpriteList::sortspritelist,(ulong)local_28);
      local_40->equal = *ppSVar3;
    }
    ppSVar3 = TArray<SortNode_*,_SortNode_*>::operator[]
                        (&SortSpriteList::sortspritelist,(ulong)local_28);
    local_40 = *ppSVar3;
    local_28 = local_28 + 1;
  }
  ppSVar3 = TArray<SortNode_*,_SortNode_*>::operator[](&SortSpriteList::sortspritelist,0);
  return *ppSVar3;
}

Assistant:

SortNode * GLDrawList::SortSpriteList(SortNode * head)
{
	SortNode * n;
	int count;
	unsigned i;

	static TArray<SortNode*> sortspritelist;

	SortNode * parent=head->parent;

	sortspritelist.Clear();
	for(count=0,n=head;n;n=n->next) sortspritelist.Push(n);
	gd=this;
	qsort(&sortspritelist[0],sortspritelist.Size(),sizeof(SortNode *),CompareSprite);
	for(i=0;i<sortspritelist.Size();i++)
	{
		sortspritelist[i]->next=NULL;
		if (parent) parent->equal=sortspritelist[i];
		parent=sortspritelist[i];
	}
	return sortspritelist[0];
}